

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject *
pybind11::detail::generic_type::new_instance(PyTypeObject *type,PyObject *param_2,PyObject *param_3)

{
  PyObject *pPVar1;
  type_info *ptVar2;
  void *pvVar3;
  internals *piVar4;
  
  pPVar1 = (PyObject *)PyType_GenericAlloc(type,0);
  ptVar2 = get_type_info(type);
  pvVar3 = operator_new(ptVar2->type_size);
  pPVar1[1].ob_refcnt = (Py_ssize_t)pvVar3;
  *(byte *)&pPVar1[2].ob_refcnt = ((byte)pPVar1[2].ob_refcnt & 0xfc) + 1;
  piVar4 = get_internals();
  std::
  _Hashtable<void_const*,std::pair<void_const*const,void*>,std::allocator<std::pair<void_const*const,void*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<void*&,_object*>
            ((_Hashtable<void_const*,std::pair<void_const*const,void*>,std::allocator<std::pair<void_const*const,void*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&piVar4->registered_instances,0,pPVar1 + 1);
  return pPVar1;
}

Assistant:

static PyObject *new_instance(PyTypeObject *type, PyObject *, PyObject *) {
        instance<void> *self = (instance<void> *) PyType_GenericAlloc((PyTypeObject *) type, 0);
        auto tinfo = detail::get_type_info(type);
        self->value = ::operator new(tinfo->type_size);
        self->owned = true;
        self->holder_constructed = false;
        detail::get_internals().registered_instances.emplace(self->value, (PyObject *) self);
        return (PyObject *) self;
    }